

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setInterfaceTag
          (CommonCore *this,InterfaceHandle handle,string_view tag,string_view value)

{
  string_view string2;
  string_view message;
  string_view message_00;
  string_view string1;
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *__str;
  uint in_ESI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_RDI;
  __pthread_internal_list *in_R8;
  __pthread_internal_list *in_R9;
  ActionMessage tagcmd;
  string_view valueStr;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *handleInfo;
  CommonCore *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  BrokerBase *this_01;
  char *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  anon_class_24_3_a8080e83 *func;
  allocator<char> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined1 local_158 [295];
  undefined1 local_31 [25];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  uint local_4;
  
  func = (anon_class_24_3_a8080e83 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  local_31._9_8_ = in_R8;
  local_31._17_8_ = in_R9;
  local_4 = in_ESI;
  if (setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
      ::trueString_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                                 ::trueString_abi_cxx11_);
    func = (anon_class_24_3_a8080e83 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
    ;
    if (iVar2 != 0) {
      func = (anon_class_24_3_a8080e83 *)local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<char>::~allocator((allocator<char> *)local_31);
      __cxa_atexit(std::__cxx11::string::~string,
                   &setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                    ::trueString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
                           ::trueString_abi_cxx11_);
    }
  }
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    local_158._244_4_ = local_4;
    local_158._248_8_ =
         getHandleInfo(in_stack_fffffffffffffe48,
                       (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    if ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
         *)local_158._248_8_ ==
        (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
         *)0x0) {
      __str = (char *)__cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe60,__str);
      message_00._M_str = (char *)in_RDI;
      message_00._M_len = (size_t)func;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffe60,message_00);
      __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(local_31 + 9));
    if (bVar1) {
      local_158._208_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe50);
    }
    else {
      local_158._216_8_ = local_31._17_8_;
      local_158._208_8_ = local_31._9_8_;
    }
    local_158._184_8_ = &local_4;
    local_158._192_8_ = &local_18;
    local_158._200_8_ = (long)local_158 + 0xd0;
    gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
    modify<helics::CommonCore::setInterfaceTag(helics::InterfaceHandle,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
              (in_RDI,func);
    if ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
         *)local_158._248_8_ !=
        (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
         *)0x0) {
      this_01 = (BrokerBase *)local_158;
      ActionMessage::ActionMessage((ActionMessage *)in_RDI,(action_t)((ulong)func >> 0x20));
      ActionMessage::setSource((ActionMessage *)this_01,*(GlobalHandle *)local_158._248_8_);
      ActionMessage::setDestination((ActionMessage *)local_158,*(GlobalHandle *)local_158._248_8_);
      string1._M_str = (char *)in_RDI;
      string1._M_len = (size_t)func;
      string2._M_str = (char *)in_stack_fffffffffffffe60;
      string2._M_len = (size_t)in_stack_fffffffffffffe58;
      ActionMessage::setStringData((ActionMessage *)this_01,string1,string2);
      BrokerBase::addActionMessage(this_01,(ActionMessage *)in_stack_fffffffffffffe48);
      ActionMessage::~ActionMessage((ActionMessage *)this_01);
    }
    return;
  }
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,in_stack_fffffffffffffe58);
  message._M_str = (char *)in_RDI;
  message._M_len = (size_t)func;
  InvalidParameter::InvalidParameter((InvalidParameter *)this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void CommonCore::setInterfaceTag(helics::InterfaceHandle handle,
                                 std::string_view tag,
                                 std::string_view value)
{
    static const std::string trueString{"true"};
    if (tag.empty()) {
        throw InvalidParameter("tag cannot be an empty string for setInterfaceTag");
    }
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw InvalidIdentifier("the handle specifier for setInterfaceTag is not valid");
        return;
    }

    std::string_view valueStr{value.empty() ? trueString : value};

    handles.modify(
        [&](auto& hdls) { hdls.getHandleInfo(handle.baseValue())->setTag(tag, valueStr); });

    if (handleInfo != nullptr) {
        ActionMessage tagcmd(CMD_INTERFACE_TAG);
        tagcmd.setSource(handleInfo->handle);
        tagcmd.setDestination(handleInfo->handle);
        tagcmd.setStringData(tag, value);
        addActionMessage(std::move(tagcmd));
    }
}